

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlNodePtr xmlSchematronGetNode(xmlSchematronValidCtxtPtr ctxt,xmlNodePtr cur,xmlChar *xpath)

{
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr ret;
  xmlNodePtr node;
  xmlChar *xpath_local;
  xmlNodePtr cur_local;
  xmlSchematronValidCtxtPtr ctxt_local;
  
  ret = (xmlXPathObjectPtr)0x0;
  if (((ctxt == (xmlSchematronValidCtxtPtr)0x0) || (cur == (xmlNodePtr)0x0)) ||
     (xpath == (xmlChar *)0x0)) {
    ctxt_local = (xmlSchematronValidCtxtPtr)0x0;
  }
  else {
    ctxt->xctxt->doc = cur->doc;
    ctxt->xctxt->node = cur;
    obj = xmlXPathEval(xpath,ctxt->xctxt);
    if (obj == (xmlXPathObjectPtr)0x0) {
      ctxt_local = (xmlSchematronValidCtxtPtr)0x0;
    }
    else {
      if (((obj->type == XPATH_NODESET) && (obj->nodesetval != (xmlNodeSetPtr)0x0)) &&
         (0 < obj->nodesetval->nodeNr)) {
        ret = (xmlXPathObjectPtr)*obj->nodesetval->nodeTab;
      }
      xmlXPathFreeObject(obj);
      ctxt_local = (xmlSchematronValidCtxtPtr)ret;
    }
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

static xmlNodePtr
xmlSchematronGetNode(xmlSchematronValidCtxtPtr ctxt,
                     xmlNodePtr cur, const xmlChar *xpath) {
    xmlNodePtr node = NULL;
    xmlXPathObjectPtr ret;

    if ((ctxt == NULL) || (cur == NULL) || (xpath == NULL))
        return(NULL);

    ctxt->xctxt->doc = cur->doc;
    ctxt->xctxt->node = cur;
    ret = xmlXPathEval(xpath, ctxt->xctxt);
    if (ret == NULL)
        return(NULL);

    if ((ret->type == XPATH_NODESET) &&
        (ret->nodesetval != NULL) && (ret->nodesetval->nodeNr > 0))
	node = ret->nodesetval->nodeTab[0];

    xmlXPathFreeObject(ret);
    return(node);
}